

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSTEI_HRR_Algorithm_Base.cpp
# Opt level: O3

void __thiscall
OSTEI_HRR_Algorithm_Base::OSTEI_HRR_Algorithm_Base
          (OSTEI_HRR_Algorithm_Base *this,OSTEI_GeneratorInfo *info)

{
  _Rb_tree_header *p_Var1;
  
  this->_vptr_OSTEI_HRR_Algorithm_Base = (_func_int **)&PTR__OSTEI_HRR_Algorithm_Base_0015bc58;
  OSTEI_GeneratorInfo::OSTEI_GeneratorInfo(&this->info_,info);
  p_Var1 = &(this->allbraam_)._M_t._M_impl.super__Rb_tree_header;
  (this->allbraam_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->allbraam_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->allbraam_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->allbraam_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->allbraam_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->allketam_)._M_t._M_impl.super__Rb_tree_header;
  (this->allketam_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->allketam_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->allketam_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->allketam_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->allketam_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->brasteps_)._M_t._M_impl.super__Rb_tree_header;
  (this->brasteps_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->brasteps_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->brasteps_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->brasteps_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->brasteps_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->ketsteps_)._M_t._M_impl.super__Rb_tree_header;
  (this->ketsteps_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->ketsteps_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->ketsteps_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->ketsteps_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->ketsteps_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->brareq_)._M_t._M_impl.super__Rb_tree_header;
  (this->brareq_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->brareq_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->brareq_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->brareq_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->brareq_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->ketreq_)._M_t._M_impl.super__Rb_tree_header;
  (this->ketreq_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->ketreq_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->ketreq_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->ketreq_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->ketreq_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->topquartets_)._M_t._M_impl.super__Rb_tree_header;
  (this->topquartets_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->topquartets_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->topquartets_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->topquartets_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->topquartets_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->topqam_)._M_t._M_impl.super__Rb_tree_header;
  (this->topqam_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->topqam_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->topqam_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->topqam_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  p_Var1 = &(this->stepmap_)._M_t._M_impl.super__Rb_tree_header;
  (this->stepmap_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->stepmap_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->amorder_).super__Vector_base<QAM,_std::allocator<QAM>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->amorder_).super__Vector_base<QAM,_std::allocator<QAM>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->topqam_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->amorder_).super__Vector_base<QAM,_std::allocator<QAM>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->stepmap_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->stepmap_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->stepmap_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  return;
}

Assistant:

OSTEI_HRR_Algorithm_Base::OSTEI_HRR_Algorithm_Base(const OSTEI_GeneratorInfo & info)
    : info_(info)
{
}